

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>
::push_back(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>
            *this,Entry *entry)

{
  ID_index IVar1;
  ID_index IVar2;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  local_30;
  undefined8 *local_20;
  Entry *local_18;
  Entry *entry_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>
  *this_local;
  
  local_18 = entry;
  entry_local = (Entry *)this;
  IVar1 = Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>
          ::get_row_index(entry);
  IVar2 = get_pivot(this);
  local_30.data_.root_plus_size_.m_header.super_node.prev_._7_1_ = 0;
  if (IVar2 < IVar1) {
    IVar1 = Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>
            ::get_row_index(local_18);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
    ::end(&local_30);
    _insert_entry(this,IVar1,(iterator *)&local_30);
    return;
  }
  local_20 = (undefined8 *)__cxa_allocate_exception(8);
  local_30.data_.root_plus_size_.m_header.super_node.prev_._7_1_ = 1;
  *local_20 = "The new row index has to be higher than the current pivot.";
  __cxa_throw(local_20,&char_const*::typeinfo,0);
}

Assistant:

inline void Intrusive_list_column<Master_matrix>::push_back(const Entry& entry)
{
  static_assert(Master_matrix::Option_list::is_of_boundary_type, "`push_back` is not available for Chain matrices.");

  GUDHI_CHECK(entry.get_row_index() > get_pivot(), "The new row index has to be higher than the current pivot.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    _insert_entry(entry.get_row_index(), column_.end());
  } else {
    _insert_entry(entry.get_element(), entry.get_row_index(), column_.end());
  }
}